

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O1

void __thiscall
nuraft::snapshot_sync_ctx::snapshot_sync_ctx
          (snapshot_sync_ctx *this,ptr<snapshot> *s,int peer_id,ulong timeout_ms,ulong offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->peer_id_ = peer_id;
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->field_2).offset_ = offset;
  this->user_snp_ctx_ = (void *)0x0;
  (this->timer_).t_created_.__d.__r = 0;
  (this->timer_).duration_us_ = 0;
  (this->timer_).first_event_fired_ = true;
  (this->timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::reset(&this->timer_);
  timer_helper::set_duration_us(&this->timer_,timeout_ms * 1000);
  return;
}

Assistant:

snapshot_sync_ctx::snapshot_sync_ctx(const ptr<snapshot>& s,
                                     int peer_id,
                                     ulong timeout_ms,
                                     ulong offset)
    : peer_id_(peer_id)
    , snapshot_(s)
    , offset_(offset)
    , user_snp_ctx_(nullptr)
{
    // 10 seconds by default.
    timer_.set_duration_ms(timeout_ms);
}